

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlidna.cpp
# Opt level: O3

QStringList * QUrl::idnWhitelist(void)

{
  int iVar1;
  Data *pDVar2;
  qsizetype qVar3;
  anon_class_1_0_00000001 *in_RSI;
  QStringList *in_RDI;
  QStringList *pQVar4;
  
  pQVar4 = user_idn_whitelist;
  if (user_idn_whitelist == (QStringList *)0x0) {
    if (idnWhitelist()::list == '\0') {
      pQVar4 = (QStringList *)&idnWhitelist()::list;
      iVar1 = __cxa_guard_acquire();
      if (iVar1 != 0) {
        idnWhitelist::anon_class_1_0_00000001::operator()(pQVar4,in_RSI);
        __cxa_atexit(QList<QString>::~QList,&idnWhitelist::list,&__dso_handle);
        __cxa_guard_release(&idnWhitelist()::list);
      }
    }
    pDVar2 = idnWhitelist::list.d.d;
    (in_RDI->d).d = idnWhitelist::list.d.d;
    (in_RDI->d).ptr = idnWhitelist::list.d.ptr;
    qVar3 = idnWhitelist::list.d.size;
  }
  else {
    pDVar2 = (user_idn_whitelist->d).d;
    (in_RDI->d).d = pDVar2;
    (in_RDI->d).ptr = (pQVar4->d).ptr;
    qVar3 = (pQVar4->d).size;
  }
  (in_RDI->d).size = qVar3;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return in_RDI;
}

Assistant:

QStringList QUrl::idnWhitelist()
{
    if (user_idn_whitelist)
        return *user_idn_whitelist;
    static const QStringList list = [] {
        QStringList list;
        list.reserve(idn_whitelist.count());
        int i = 0;
        while (i < idn_whitelist.count()) {
            list << QLatin1StringView(idn_whitelist.at(i));
            ++i;
        }
        return list;
    }();
    return list;
}